

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O3

int __thiscall
cmsys::SystemInformationImplementation::GetProcessorCacheXSize
          (SystemInformationImplementation *this,long dwCacheID)

{
  int iVar1;
  
  if (dwCacheID == 0x20000) {
    iVar1 = (this->Features).L3CacheSize;
  }
  else {
    if (dwCacheID == 0x10000) {
      return (this->Features).L2CacheSize;
    }
    iVar1 = -1;
    if (dwCacheID == 0x8000) {
      return (this->Features).L1CacheSize;
    }
  }
  return iVar1;
}

Assistant:

int SystemInformationImplementation::GetProcessorCacheXSize(
  long int dwCacheID) const
{
  switch (dwCacheID) {
    case SystemInformation::CPU_FEATURE_L1CACHE:
      return this->Features.L1CacheSize;
    case SystemInformation::CPU_FEATURE_L2CACHE:
      return this->Features.L2CacheSize;
    case SystemInformation::CPU_FEATURE_L3CACHE:
      return this->Features.L3CacheSize;
  }
  return -1;
}